

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

char * Abc_SopCreateNor(Mem_Flex_t *pMan,int nVars)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  
  pcVar1 = Abc_SopStart(pMan,1,nVars);
  uVar2 = 0;
  uVar3 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pcVar1[uVar2] = '0';
  }
  return pcVar1;
}

Assistant:

char * Abc_SopCreateNor( Mem_Flex_t * pMan, int nVars )
{
    char * pSop;
    int i;
    pSop = Abc_SopStart( pMan, 1, nVars );
    for ( i = 0; i < nVars; i++ )
        pSop[i] = '0';
    return pSop;
}